

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall Node::Node(Node *this,player_move *move,Node *parent)

{
  Node *parent_local;
  player_move *move_local;
  Node *this_local;
  
  this->m_parent_node = parent;
  this->exploration = 0.7;
  this->m_move = move;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->m_children);
  this->m_wins = 0;
  this->m_visits = 0;
  this->m_avails = 1;
  return;
}

Assistant:

Node(player_move* move, Node* parent) :
        m_move(move),
        m_parent_node(parent)
    {
    }